

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

char * ExportLabelToSld(char *naam,SLabelTableEntry *label)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  SLabelTableEntry *local_48;
  SLabelTableEntry *local_40;
  size_t modNameSz;
  char *mainLabel;
  bool isStructLabel;
  bool inModule;
  bool inMacro;
  bool local;
  bool global;
  bool escMacro;
  bool setNameSpace;
  SLabelTableEntry *label_local;
  char *naam_local;
  
  if (label == (SLabelTableEntry *)0x0) {
    __assert_fail("nullptr != label",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                  ,0x7e,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
  }
  bVar4 = *naam != '!';
  label_local = (SLabelTableEntry *)naam;
  if (!bVar4) {
    label_local = (SLabelTableEntry *)(naam + 1);
  }
  bVar5 = false;
  if (((bVar4) && (bVar5 = false, macrolabp != (char *)0x0)) &&
     (bVar5 = false, (char)label_local->value == '@')) {
    bVar5 = *(char *)((long)&label_local->value + 1) == '.';
  }
  if (bVar5) {
    label_local = (SLabelTableEntry *)((long)&label_local->value + 1);
  }
  bVar2 = isLabelStart((char *)label_local,true);
  if (bVar2) {
    bVar2 = (char)label_local->value == '@';
    bVar6 = (char)label_local->value == '.';
    if ((bVar2) || (bVar6)) {
      label_local = (SLabelTableEntry *)((long)&label_local->value + 1);
    }
    bVar7 = false;
    if ((!bVar5) && (bVar7 = false, bVar6)) {
      bVar7 = macrolabp != (char *)0x0;
    }
    bVar5 = false;
    if ((!bVar7) && (bVar5 = false, !bVar2)) {
      bVar5 = ModuleName[0] != '\0';
    }
    uVar1 = label->traits;
    sldLabelExport[0] = '\0';
    if (bVar5) {
      strncat(sldLabelExport,ModuleName,0x800);
    }
    strncat(sldLabelExport,",",2);
    if (((uVar1 & 0x18) == 0) || (bVar6)) {
      if (bVar7) {
        local_48 = (SLabelTableEntry *)macrolabp;
      }
      else {
        local_48 = (SLabelTableEntry *)vorlabp;
      }
      local_40 = local_48;
    }
    else {
      local_40 = label_local;
    }
    modNameSz = (size_t)local_40;
    if (!bVar4) {
      modNameSz = (size_t)label_local;
    }
    if ((vorlabp == (char *)modNameSz) && (ModuleName[0] != '\0')) {
      __n = strlen(ModuleName);
      iVar3 = strncmp(ModuleName,(char *)modNameSz,__n);
      if (iVar3 == 0) {
        modNameSz = __n + 1 + modNameSz;
      }
    }
    strncat(sldLabelExport,(char *)modNameSz,0x40);
    strncat(sldLabelExport,",",2);
    if (bVar6) {
      strncat(sldLabelExport,(char *)label_local,0x40);
    }
    if ((label->traits & 4) != 0) {
      strncat(sldLabelExport,",+equ",0x14);
    }
    if (bVar7) {
      strncat(sldLabelExport,",+macro",0x14);
    }
    if ((label->traits & 0x80) != 0) {
      strncat(sldLabelExport,",+smc",0x14);
    }
    if (label->isRelocatable == REGULAR) {
      strncat(sldLabelExport,",+reloc",0x14);
    }
    if (label->isRelocatable == HIGH) {
      strncat(sldLabelExport,",+reloc_high",0x14);
    }
    if ((label->used & 1U) != 0) {
      strncat(sldLabelExport,",+used",0x14);
    }
    if ((label->traits & 8) != 0) {
      strncat(sldLabelExport,",+struct_def",0x14);
    }
    if ((label->traits & 0x10) != 0) {
      strncat(sldLabelExport,",+struct_data",0x14);
    }
    return sldLabelExport;
  }
  __assert_fail("isLabelStart(naam)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/tables.cpp"
                ,0x85,"char *ExportLabelToSld(const char *, const SLabelTableEntry *)");
}

Assistant:

char* ExportLabelToSld(const char* naam, const SLabelTableEntry* label) {
	// does re-parse the original source line again similarly to ValidateLabel
	// but prepares SLD 'L'-type line, with module/main/local comma separated + usage traits info
	assert(nullptr != label);
	// check if this is setting namespace
	bool setNameSpace = ('!' != *naam);
	if (!setNameSpace) ++naam;
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	assert(isLabelStart(naam));		// this should be called only when ValidateLabel did succeed
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && ModuleName[0];
	const bool isStructLabel = (label->traits & (LABEL_IS_STRUCT_D|LABEL_IS_STRUCT_E));
	// build fully qualified SLD info
	sldLabelExport[0] = 0;
	// module part
	if (inModule) STRCAT(sldLabelExport, LINEMAX, ModuleName);
	STRCAT(sldLabelExport, 2, ",");
	// main label part (the `vorlabp` is already the current label, if it was main label)
	// except for structure labels: the inner ones don't "set namespace" == vorlabp, use "naam" then
	// (but only if the main label of structure itself is not local, if it's local, use vorlabp)
	const char* mainLabel = isStructLabel && !local ? naam : inMacro ? macrolabp : vorlabp;
	if (!setNameSpace) mainLabel = naam;
	if (vorlabp == mainLabel && ModuleName[0]) {	// vorlabp now contains also module part, skip it
		auto modNameSz = strlen(ModuleName);
		if (0 == strncmp(ModuleName, mainLabel, modNameSz)) mainLabel += modNameSz + 1;
	}
	STRCAT(sldLabelExport, LABMAX, mainLabel);
	STRCAT(sldLabelExport, 2, ",");
	// local part
	if (local) STRCAT(sldLabelExport, LABMAX, naam);
	// usage traits
	if (label->traits&LABEL_IS_EQU) STRCAT(sldLabelExport, 20, ",+equ");
	if (inMacro) STRCAT(sldLabelExport, 20, ",+macro");
	if (label->traits&LABEL_IS_SMC) STRCAT(sldLabelExport, 20, ",+smc");
	if (Relocation::REGULAR == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc");
	if (Relocation::HIGH == label->isRelocatable) STRCAT(sldLabelExport, 20, ",+reloc_high");
	if (label->used) STRCAT(sldLabelExport, 20, ",+used");
	if (label->traits&LABEL_IS_STRUCT_D) STRCAT(sldLabelExport, 20, ",+struct_def");
	if (label->traits&LABEL_IS_STRUCT_E) STRCAT(sldLabelExport, 20, ",+struct_data");
	return sldLabelExport;
}